

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O1

void __thiscall bidirectional::BiDirectional::joinLabels(BiDirectional *this)

{
  double dVar1;
  int iVar2;
  _Rb_tree_color _Var3;
  Params *pPVar4;
  Search *pSVar5;
  DiGraph *pDVar6;
  Label *pLVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Vertex VVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  double *fwd_min;
  double *pdVar12;
  long lVar13;
  _Base_ptr p_Var14;
  long lVar15;
  Label *fwd_label;
  long lVar16;
  Label *bwd_label;
  byte bVar17;
  byte bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  vector<labelling::Label,_std::allocator<labelling::Label>_> merged_labels_;
  bool local_17b;
  byte local_17a;
  byte local_179;
  double local_178;
  int local_16c;
  AdjVertex local_168;
  double *local_130;
  double *local_128;
  vector<double,_std::allocator<double>_> *local_120;
  double *local_118;
  Params *local_110;
  LemonArc local_108 [2];
  _Head_base<0UL,_lemon::SmartDigraph_*,_false> local_100;
  vector<labelling::Label,_std::allocator<labelling::Label>_> local_f8;
  double local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  BiDirectional *local_c8;
  long local_c0;
  long local_b8;
  Label local_b0;
  
  pPVar4 = (this->params_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
           .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl;
  local_178 = getUB(this);
  iVar2 = pPVar4->critical_res;
  local_118 = (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + iVar2;
  pdVar12 = (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + iVar2;
  dVar1 = *local_118;
  if (*pdVar12 <= dVar1 && dVar1 != *pdVar12) {
    local_118 = pdVar12;
  }
  local_110 = pPVar4;
  fwd_min = (double *)operator_new(8);
  *fwd_min = 0.0;
  local_128 = fwd_min;
  pdVar12 = (double *)operator_new(8);
  *pdVar12 = 0.0;
  getMinimumWeights(this,fwd_min,pdVar12);
  local_f8.super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar5 = (this->fwd_search_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
           .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
  p_Var14 = *(_Base_ptr *)((long)&(pSVar5->visited_vertices)._M_t + 0x18);
  local_d0 = (_Base_ptr)((long)&(pSVar5->visited_vertices)._M_t + 8);
  if (p_Var14 != local_d0) {
    local_120 = &this->min_res;
    local_130 = pdVar12;
    local_c8 = this;
    do {
      pSVar5 = (this->fwd_search_ptr_)._M_t.
               super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
               .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
      _Var3 = p_Var14[1]._M_color;
      bVar17 = 1;
      if ((**(double **)
             (*(long *)&(pSVar5->best_labels).
                        super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                        ._M_impl + (long)(int)_Var3 * 0x10) + *pdVar12 <= local_178) &&
         (_Var3 != (((this->graph_ptr_)._M_t.
                     super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                     .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->sink).
                   lemon_id)) {
        fwd_label = *(Label **)
                     (*(long *)&(pSVar5->efficient_labels).
                                super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                                ._M_impl + (long)(int)_Var3 * 0x18);
        lVar13 = (long)(int)p_Var14[1]._M_color;
        bVar17 = fwd_label ==
                 *(Label **)
                  (*(long *)&(((this->fwd_search_ptr_)._M_t.
                               super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                               .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl)
                             ->efficient_labels).
                             super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                             ._M_impl + 8 + lVar13 * 0x18);
        local_d8 = p_Var14;
        while (!(bool)bVar17) {
          bVar18 = 1;
          if (((fwd_label->resource_consumption).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start[local_110->critical_res] <= *local_118) &&
             (fwd_label->weight + *pdVar12 <= local_178)) {
            local_100._M_head_impl =
                 *(SmartDigraph **)
                  &(((this->graph_ptr_)._M_t.
                     super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                     .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->
                   lemon_graph_ptr)._M_t.
                   super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
            ;
            local_17a = bVar17;
            for (local_108[0]._id = *(int *)(*(long *)local_100._M_head_impl + 4 + lVar13 * 8);
                bVar18 = local_108[0]._id == -1, p_Var14 = local_d8, pdVar12 = local_130,
                fwd_min = local_128, bVar17 = local_17a, !(bool)bVar18;
                local_108[0]._id =
                     *(int *)(*(long *)((long)local_100._M_head_impl + 0x18) + 0xc +
                             (long)local_108[0]._id * 0x10)) {
              pDVar6 = (this->graph_ptr_)._M_t.
                       super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                       .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl;
              lVar16 = (long)local_108[0]._id;
              iVar2 = *(int *)(*(long *)((long)(pDVar6->lemon_graph_ptr)._M_t.
                                               super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
                                        + 0x18) + lVar16 * 0x10);
              lVar15 = (long)iVar2;
              lVar13 = *(long *)((long)(pDVar6->weight_map_ptr)._M_t.
                                       super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                                + 0x18);
              local_b0.weight._0_4_ = 1;
              local_179 = bVar18;
              local_16c = iVar2;
              bVar9 = checkVertexVisited(this,(Directions *)&local_b0,&local_16c);
              if ((bVar9) && (iVar2 != (pDVar6->source).lemon_id)) {
                pSVar5 = (this->bwd_search_ptr_)._M_t.
                         super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                         .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
                bVar9 = true;
                local_b8 = lVar13;
                if (fwd_label->weight + *(double *)(lVar13 + lVar16 * 8) +
                    **(double **)
                      (*(long *)&(pSVar5->best_labels).
                                 super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                                 ._M_impl + lVar15 * 0x10) <= local_178) {
                  bwd_label = *(Label **)
                               (*(long *)&(pSVar5->efficient_labels).
                                          super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                                          ._M_impl + lVar15 * 0x18);
                  bVar9 = bwd_label ==
                          *(Label **)
                           (*(long *)&(((this->bwd_search_ptr_)._M_t.
                                        super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                                        .super__Head_base<0UL,_bidirectional::Search_*,_false>.
                                       _M_head_impl)->efficient_labels).
                                      super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                                      ._M_impl + 8 + lVar15 * 0x18);
                  local_c0 = lVar16;
                  while (!bVar9) {
                    bVar11 = true;
                    if (((*local_118 <=
                          (bwd_label->resource_consumption).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[local_110->critical_res]) &&
                        (fwd_label->weight + *(double *)(local_b8 + local_c0 * 8) +
                         bwd_label->weight <= local_178)) &&
                       (bVar10 = labelling::mergePreCheck(fwd_label,bwd_label,&this->max_res),
                       bVar10)) {
                      local_17b = true;
                      DiGraph::getAdjVertex
                                (&local_168,
                                 (this->graph_ptr_)._M_t.
                                 super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                                 .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>.
                                 _M_head_impl,local_108,&local_17b);
                      labelling::mergeLabels
                                (&local_b0,fwd_label,bwd_label,&local_168,
                                 &((this->graph_ptr_)._M_t.
                                   super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                                   .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>.
                                  _M_head_impl)->sink,&this->max_res,local_120);
                      if (local_168.resource_consumption.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_168.resource_consumption.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                        (long)local_168.resource_consumption.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_168.resource_consumption.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_b0.vertex.lemon_id == -1) {
LAB_00136a8b:
                        bVar11 = true;
                        std::vector<labelling::Label,_std::allocator<labelling::Label>_>::push_back
                                  (&local_f8,&local_b0);
                      }
                      else {
                        local_168.vertex = (Vertex)((ulong)local_168.vertex & 0xffffffffffffff00);
                        bVar11 = labelling::Label::checkFeasibility
                                           (&local_b0,&this->max_res,local_120,(bool *)&local_168);
                        if ((!bVar11) ||
                           (bVar11 = labelling::halfwayCheck(&local_b0,&local_f8), !bVar11))
                        goto LAB_00136a8b;
                        pLVar7 = (this->best_label_).
                                 super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                        if ((pLVar7->vertex).lemon_id != -1) {
                          local_168.vertex = (Vertex)((ulong)local_168.vertex & 0xffffffff00000000);
                          bVar11 = labelling::Label::fullDominance
                                             (&local_b0,pLVar7,(Directions *)&local_168);
                          if ((!bVar11) &&
                             (dVar1 = ((this->best_label_).
                                       super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->weight,
                             dVar1 < (double)CONCAT44(local_b0.weight._4_4_,local_b0.weight._0_4_)
                             || dVar1 == (double)CONCAT44(local_b0.weight._4_4_,
                                                          local_b0.weight._0_4_)))
                          goto LAB_00136a8b;
                        }
                        local_168.vertex.lemon_id = 0;
                        local_168.vertex.user_id = 0;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<labelling::Label,std::allocator<labelling::Label>,labelling::Label_const&>
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_168.weight,
                                   (Label **)&local_168,(allocator<labelling::Label> *)&local_17b,
                                   &local_b0);
                        dVar1 = local_168.weight;
                        VVar8 = local_168.vertex;
                        local_168.vertex.lemon_id = 0;
                        local_168.vertex.user_id = 0;
                        local_168.weight = 0.0;
                        this_00 = (this->best_label_).
                                  super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                        (this->best_label_).
                        super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)VVar8;
                        (this->best_label_).
                        super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar1;
                        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.weight !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_168.weight);
                        }
                        pLVar7 = (this->best_label_).
                                 super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                        local_e0 = pLVar7->weight;
                        local_168.vertex = (Vertex)((ulong)local_168.vertex & 0xffffffff00000000);
                        bVar11 = terminate(this,(Directions *)&local_168,pLVar7);
                        uVar19 = SUB84(local_e0,0);
                        uVar20 = (undefined4)((ulong)local_e0 >> 0x20);
                        if (local_178 <= local_e0) {
                          uVar19 = SUB84(local_178,0);
                          uVar20 = (undefined4)((ulong)local_178 >> 0x20);
                        }
                        if (!bVar11) {
                          local_178 = (double)CONCAT44(uVar20,uVar19);
                          goto LAB_00136a8b;
                        }
                        bVar11 = false;
                        local_178 = (double)CONCAT44(uVar20,uVar19);
                      }
                      labelling::Label::~Label(&local_b0);
                      this = local_c8;
                    }
                    if (!bVar11) break;
                    bwd_label = bwd_label + 1;
                    bVar9 = bwd_label ==
                            *(Label **)
                             (*(long *)&(((this->bwd_search_ptr_)._M_t.
                                          super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                                          .super__Head_base<0UL,_bidirectional::Search_*,_false>.
                                         _M_head_impl)->efficient_labels).
                                        super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                                        ._M_impl + 8 + lVar15 * 0x18);
                  }
                }
              }
              else {
                bVar9 = true;
              }
              p_Var14 = local_d8;
              pdVar12 = local_130;
              fwd_min = local_128;
              bVar17 = local_17a;
              bVar18 = local_179;
              if (!bVar9) break;
            }
          }
          if ((bVar18 & 1) == 0) break;
          fwd_label = fwd_label + 1;
          lVar13 = (long)(int)p_Var14[1]._M_color;
          bVar17 = fwd_label ==
                   *(Label **)
                    (*(long *)&(((this->fwd_search_ptr_)._M_t.
                                 super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                                 .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl
                                )->efficient_labels).
                               super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                               ._M_impl + 8 + lVar13 * 0x18);
        }
      }
    } while (((bVar17 & 1) != 0) &&
            (p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14), p_Var14 != local_d0));
  }
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::~vector(&local_f8);
  operator_delete(pdVar12,8);
  operator_delete(fwd_min,8);
  return;
}

Assistant:

void BiDirectional::joinLabels() {
  // ref id with critical_res
  SPDLOG_INFO("Merging");
  const int&    c_res   = params_ptr_->critical_res;
  double        UB      = getUB();
  const double& HF      = std::min(max_res_curr_[c_res], min_res_curr_[c_res]);
  auto          fwd_min = std::make_unique<double>();
  auto          bwd_min = std::make_unique<double>();
  // lower bounds on forward and backward labels
  getMinimumWeights(fwd_min.get(), bwd_min.get());

  std::vector<labelling::Label> merged_labels_;

  // for each vertex visited forward
  for (const int& n : fwd_search_ptr_->visited_vertices) {
    // if bound check fwd_label
    if (fwd_search_ptr_->best_labels[n]->weight + *bwd_min <= UB &&
        n != graph_ptr_->sink.lemon_id) {
      // for each forward label at n
      for (auto fwd_iter = fwd_search_ptr_->efficient_labels[n].cbegin();
           fwd_iter != fwd_search_ptr_->efficient_labels[n].cend();
           ++fwd_iter) {
        const labelling::Label& fwd_label = *fwd_iter;
        // if bound check fwd_label
        if (fwd_label.resource_consumption[c_res] <= HF &&
            fwd_label.weight + *bwd_min <= UB) {
          // for each successor of n
          for (LemonGraph::OutArcIt a(
                   *graph_ptr_->lemon_graph_ptr, graph_ptr_->getLNodeFromId(n));
               a != lemon::INVALID;
               ++a) {
            const int&    m           = graph_ptr_->getId(graph_ptr_->head(a));
            const double& edge_weight = graph_ptr_->getWeight(a);
            if (checkVertexVisited(BWD, m) &&
                m != graph_ptr_->source.lemon_id &&
                (fwd_label.weight + edge_weight +
                     bwd_search_ptr_->best_labels[m]->weight <=
                 UB)) {
              // for each backward label at m
              for (auto bwd_iter =
                       bwd_search_ptr_->efficient_labels[m].cbegin();
                   bwd_iter != bwd_search_ptr_->efficient_labels[m].cend();
                   ++bwd_iter) {
                const labelling::Label& bwd_label = *bwd_iter;
                // TODO: should suffice with strict > HF, but Beasley 10
                // fails
                if (bwd_label.resource_consumption[c_res] >= HF &&
                    (fwd_label.weight + edge_weight + bwd_label.weight <= UB) &&
                    labelling::mergePreCheck(fwd_label, bwd_label, max_res)) {
                  const labelling::Label& merged_label = labelling::mergeLabels(
                      fwd_label,
                      bwd_label,
                      graph_ptr_->getAdjVertex(a, true),
                      graph_ptr_->sink,
                      max_res,
                      min_res);
                  if (merged_label.vertex.lemon_id != -1 &&
                      merged_label.checkFeasibility(max_res, min_res) &&
                      labelling::halfwayCheck(merged_label, merged_labels_)) {
                    if (best_label_->vertex.lemon_id == -1 ||
                        (merged_label.fullDominance(*best_label_, FWD) ||
                         merged_label.weight < best_label_->weight)) {
                      // Save
                      best_label_ =
                          std::make_shared<labelling::Label>(merged_label);
                      SPDLOG_INFO(
                          "\t {} \t | \t {}",
                          getElapsedTime(),
                          best_label_->weight);
                      // Tighten UB
                      if (best_label_->weight < UB) {
                        UB = best_label_->weight;
                      }
                      // Stop if time out or threshold found
                      if (terminate(FWD, *best_label_)) {
                        return;
                      }
                    }
                  }
                  // Add merged label to list
                  merged_labels_.push_back(merged_label);
                } // else
                  // break;
              }
            }
          }
        } // else
          // break;
      }
    }
  }
}